

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_lua.cpp
# Opt level: O3

string * __thiscall
flatbuffers::anon_unknown_25::LuaBfbsGenerator::GenerateStructBuilderArgs
          (string *__return_storage_ptr__,LuaBfbsGenerator *this,Object *object,string *prefix)

{
  _Any_data local_48;
  string *local_38;
  code *pcStack_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_38 = (string *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x18);
  *(LuaBfbsGenerator **)local_48._M_unused._0_8_ = this;
  *(string **)((long)local_48._M_unused._0_8_ + 8) = __return_storage_ptr__;
  *(string **)((long)local_48._M_unused._0_8_ + 0x10) = prefix;
  pcStack_30 = std::
               _Function_handler<void_(const_reflection::Field_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/bfbs_gen_lua.cpp:470:45)>
               ::_M_invoke;
  local_38 = (string *)
             std::
             _Function_handler<void_(const_reflection::Field_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/bfbs_gen_lua.cpp:470:45)>
             ::_M_manager;
  BaseBfbsGenerator::ForAllFields
            (&this->super_BaseBfbsGenerator,object,false,
             (function<void_(const_reflection::Field_*)> *)&local_48);
  if (local_38 != (string *)0x0) {
    local_38 = (string *)(*(code *)local_38)(&local_48,&local_48,3);
  }
  return local_38;
}

Assistant:

std::string GenerateStructBuilderArgs(const r::Object *object,
                                        std::string prefix = "") const {
    std::string signature;
    ForAllFields(object, /*reverse=*/false, [&](const r::Field *field) {
      if (IsStructOrTable(field->type()->base_type())) {
        const r::Object *field_object = GetObject(field->type());
        signature += GenerateStructBuilderArgs(
            field_object, prefix + namer_.Variable(*field) + "_");
      } else {
        signature += ", " + prefix + namer_.Variable(*field);
      }
    });
    return signature;
  }